

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O1

URI * GeneratedSaxParser::Utils::toURI(URI *__return_storage_ptr__,ParserChar **buffer,bool *failed)

{
  ParserString PVar1;
  
  if (**buffer == '\0') {
    *failed = false;
    COLLADABU::URI::URI(__return_storage_ptr__,(char *)0x0);
  }
  else {
    PVar1 = toStringListItem(buffer,failed);
    COLLADABU::URI::URI(__return_storage_ptr__,PVar1.super_UnionString.str,
                        PVar1.super_UnionString.length);
  }
  return __return_storage_ptr__;
}

Assistant:

COLLADABU::URI Utils::toURI(const ParserChar** buffer, bool& failed)
    {
        if ( **buffer == '\0' )
        {
            failed = false;
            return COLLADABU::URI(0);
        }
        
        const ParserString& string = toStringListItem(buffer, failed);
        return COLLADABU::URI(string.str, string.length);
        
        //FIXME: Testing fails on windows but pass on OSX with this fix.
        //Just get the string as it is for ids, so that we are able to read FBX-COLLADA
        //Otherwise, calling toStringItem would result in a truncated string when an id contains spaces
        //return COLLADABU::URI((const char*)*buffer);
    }